

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_DETECT_SOUL(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  char *fmt;
  
  _Var1 = detect_monsters(context->y,context->x,monster_has_spirit);
  if (_Var1) {
    fmt = "You sense the presence of spirits!";
  }
  else {
    if (context->aware != true) goto LAB_0013f522;
    fmt = "You sense no spirits.";
  }
  msg(fmt);
LAB_0013f522:
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_SOUL(effect_handler_context_t *context)
{
	bool monsters = detect_monsters(context->y, context->x, monster_has_spirit);

	if (monsters)
		msg("You sense the presence of spirits!");
	else if (context->aware)
		msg("You sense no spirits.");

	context->ident = true;
	return true;
}